

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
deqp::gles3::Functional::getDefaultFBDiscardAttachments
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          deUint32 discardBufferBits)

{
  value_type_conflict2 local_34 [6];
  value_type_conflict2 local_1c;
  undefined1 local_15;
  uint local_14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_10;
  deUint32 discardBufferBits_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *attachments;
  
  local_15 = 0;
  local_14 = discardBufferBits;
  pvStack_10 = __return_storage_ptr__;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  if ((local_14 & 0x4000) != 0) {
    local_1c = 0x1800;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,&local_1c);
  }
  if ((local_14 & 0x100) != 0) {
    local_34[1] = 0x1801;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,local_34 + 1);
  }
  if ((local_14 & 0x400) != 0) {
    local_34[0] = 0x1802;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,local_34);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<deUint32> getDefaultFBDiscardAttachments (deUint32 discardBufferBits)
{
	vector<deUint32> attachments;

	if (discardBufferBits & GL_COLOR_BUFFER_BIT)
		attachments.push_back(GL_COLOR);

	if (discardBufferBits & GL_DEPTH_BUFFER_BIT)
		attachments.push_back(GL_DEPTH);

	if (discardBufferBits & GL_STENCIL_BUFFER_BIT)
		attachments.push_back(GL_STENCIL);

	return attachments;
}